

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O3

bool __thiscall kws::Generator::CreateFooter(Generator *this,ostream *file)

{
  ostream *poVar1;
  char *format;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(file,"<hr size=\"1\">",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (file,"<table width=\"100%\" border=\"0\">",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>(file,"<tr>",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (file,
             "<td>Generated by <a href=\"https://public.kitware.com/KWStyle\">KWStyle</a> 1.0b on <i>"
             ,0x55);
  kwssys::SystemTools::GetCurrentDateTime_abi_cxx11_
            (&local_58,(SystemTools *)"%A %B,%d at %I:%M:%S%p",format);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (file,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</i></td>",9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(file,"<td>",4);
  if ((this->m_KWStyleLogo)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (file,"<div align=\"center\"><img src=\"images/",0x25);
    std::__cxx11::string::string
              ((string *)&local_38,(this->m_KWStyleLogo)._M_dataplus._M_p,&local_59);
    kwssys::SystemTools::GetFilenameName(&local_58,&local_38);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (file,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" height=\"49\" /></div>",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(file,"</td>",5);
  std::__ostream_insert<char,std::char_traits<char>>(file,"<td>",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (file,
             "<div align=\"right\"><a href=\"http://www.kitware.com\">&copy; Kitware Inc.</a></div></td>"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>(file,"</tr>",5);
  std::__ostream_insert<char,std::char_traits<char>>(file,"</table>",8);
  std::__ostream_insert<char,std::char_traits<char>>(file,"<br />",6);
  std::__ostream_insert<char,std::char_traits<char>>(file,"</html>",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + (char)file);
  std::ostream::put((char)file);
  std::ostream::flush();
  return true;
}

Assistant:

bool Generator::CreateFooter(std::ostream * file)
{
  *file << "<hr size=\"1\">";
  *file << R"(<table width="100%" border="0">)";
  *file << "<tr>";
  *file << "<td>Generated by <a href=\"https://public.kitware.com/KWStyle\">KWStyle</a> 1.0b on <i>" << kwssys::SystemTools::GetCurrentDateTime("%A %B,%d at %I:%M:%S%p") << "</i></td>";
  *file << "<td>";
  if (!m_KWStyleLogo.empty()) {
    *file << R"(<div align="center"><img src="images/)"
          << kwssys::SystemTools::GetFilenameName(m_KWStyleLogo.c_str())
          << R"(" height="49" /></div>)" << std::endl;
  }
  *file << "</td>";
  *file << "<td>";
  *file
      << R"(<div align="right"><a href="http://www.kitware.com">&copy; Kitware Inc.</a></div></td>)";
  *file << "</tr>";
  *file << "</table>";
  *file << "<br />";

  *file << "</html>" << std::endl;

  return true;
}